

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test::
~BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test
          (BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test *this)

{
  BasicAuthIntegrationTest::~BasicAuthIntegrationTest(&this->super_BasicAuthIntegrationTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldPerformProperAuthentication) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, username_.c_str());
    curl_easy_setopt(curl, CURLOPT_PASSWORD, password_.c_str());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, HasSubstr(counter_name_));
}